

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O0

void __thiscall license::hw_identifier::HwIdentifier::HwIdentifier(HwIdentifier *this,string *param)

{
  size_type sVar1;
  logic_error *this_00;
  iterator __first;
  iterator __result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  char local_4a [2];
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [8];
  string tmp_str;
  string *param_local;
  HwIdentifier *this_local;
  
  this->_vptr_HwIdentifier = (_func_int **)&PTR__HwIdentifier_005c9930;
  *(undefined8 *)(this->m_data)._M_elems = 0;
  tmp_str.field_2._8_8_ = param;
  std::__cxx11::string::string((string *)local_38,(string *)param);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48 = (char *)std::__cxx11::string::end();
  local_4a[1] = 0x2d;
  local_4a[0] = '\n';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_48,local_4a + 1,local_4a);
  unbase64((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,(string *)local_38);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  if (sVar1 != 8) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    std::ostream::operator<<(&std::cerr,sVar1);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_98,"wrong identifier size ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   tmp_str.field_2._8_8_);
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  __result = std::array<unsigned_char,_8UL>::begin(&this->m_data);
  std::
  copy_n<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int,unsigned_char*>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,8,__result);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

HwIdentifier::HwIdentifier(const std::string& param) {
	string tmp_str(param);  // throw away const
	std::replace(tmp_str.begin(), tmp_str.end(), '-', '\n');
	vector<uint8_t> decoded = unbase64(tmp_str);
	if (decoded.size() != HW_IDENTIFIER_PROPRIETARY_DATA + 1) {
		cerr << decoded.size();
		throw logic_error("wrong identifier size " + param);
	}
	std::copy_n(decoded.begin(), HW_IDENTIFIER_PROPRIETARY_DATA + 1, m_data.begin());
}